

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_execresult(lua_State *L,int stat)

{
  char *local_28;
  char *what;
  int stat_local;
  lua_State *L_local;
  
  local_28 = "exit";
  if (stat == -1) {
    L_local._4_4_ = luaL_fileresult(L,0,(char *)0x0);
  }
  else {
    if ((stat & 0x7fU) == 0) {
      what._4_4_ = (int)(stat & 0xff00U) >> 8;
    }
    else {
      what._4_4_ = stat;
      if ('\0' < (char)(((byte)stat & 0x7f) + 1) >> 1) {
        what._4_4_ = stat & 0x7f;
        local_28 = "signal";
      }
    }
    if ((*local_28 == 'e') && (what._4_4_ == 0)) {
      lua_pushboolean(L,1);
    }
    else {
      lua_pushnil(L);
    }
    lua_pushstring(L,local_28);
    lua_pushinteger(L,(long)(int)what._4_4_);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  const char *what = "exit";  /* type of termination */
  if (stat == -1)  /* error? */
    return luaL_fileresult(L, 0, NULL);
  else {
    l_inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      lua_pushnil(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/nil,what,code */
  }
}